

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_copy(lua_State *L,int fromidx,int toidx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *io2;
  TValue *io1;
  TValue *to;
  TValue *fr;
  int toidx_local;
  int fromidx_local;
  lua_State *L_local;
  
  pTVar1 = index2value(L,fromidx);
  pTVar2 = index2value(L,toidx);
  pTVar2->value_ = pTVar1->value_;
  pTVar2->tt_ = pTVar1->tt_;
  if ((((toidx < -0xf4628) && ((pTVar1->tt_ & 0x40) != 0)) &&
      ((((((L->ci->func).p)->val).value_.gc)->marked & 0x20) != 0)) &&
     ((((pTVar1->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(((L->ci->func).p)->val).value_.gc,(pTVar1->value_).gc);
  }
  return;
}

Assistant:

LUA_API void lua_copy (lua_State *L, int fromidx, int toidx) {
  TValue *fr, *to;
  lua_lock(L);
  fr = index2value(L, fromidx);
  to = index2value(L, toidx);
  api_check(L, isvalid(L, to), "invalid index");
  setobj(L, to, fr);
  if (isupvalue(toidx))  /* function upvalue? */
    luaC_barrier(L, clCvalue(s2v(L->ci->func.p)), fr);
  /* LUA_REGISTRYINDEX does not need gc barrier
     (collector revisits it before finishing collection) */
  lua_unlock(L);
}